

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_thread.cxx
# Opt level: O1

pl_cond_and_mutex_t * ndiEventCreate(void)

{
  pl_cond_and_mutex_t *ppVar1;
  
  ppVar1 = (pl_cond_and_mutex_t *)malloc(0x60);
  ppVar1->signalled = 0;
  pthread_cond_init((pthread_cond_t *)&ppVar1->cond,(pthread_condattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)&ppVar1->mutex,(pthread_mutexattr_t *)0x0);
  return ppVar1;
}

Assistant:

ndicapiExport pl_cond_and_mutex_t* ndiEventCreate()
{
  pl_cond_and_mutex_t* event;
  event = (pl_cond_and_mutex_t*)malloc(sizeof(pl_cond_and_mutex_t));
  event->signalled = 0;
  pthread_cond_init(&event->cond, 0);
  pthread_mutex_init(&event->mutex, 0);
  return event;
}